

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Generators_Uniform1DSeed_Test::TestBody(Generators_Uniform1DSeed_Test *this)

{
  char *message;
  long lVar1;
  Float u_1;
  Float u;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  Uniform1DIter __begin1;
  vector<float,_std::allocator<float>_> samples;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Uniform1DIter __end1;
  IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> local_48 [2];
  undefined8 local_40;
  undefined8 local_38;
  
  samples.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48[0].n = 0x4e2;
  local_40 = 0;
  samples.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  samples.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38 = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            (&__begin1,local_48);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            (&__end1,local_48);
  for (; __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
      super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
    u = pbrt::RNG::Uniform<float>(&__begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
    std::vector<float,_std::allocator<float>_>::push_back(&samples,&u);
  }
  local_48[0].n =
       (int)((ulong)((long)samples.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)samples.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  local_40 = 1;
  local_38 = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
            (&__begin1,local_48);
  pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
            (&__end1,local_48);
  lVar1 = 0;
  for (; __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
         super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
      super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
    u_1 = pbrt::RNG::Uniform<float>(&__begin1.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
    testing::internal::CmpHelperNE<float,float>
              ((internal *)&u,"u","samples[i]",&u_1,
               (float *)((long)samples.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar1));
    if (u._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_68);
      message = "";
      if (local_a8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = ((local_a8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x445,message);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_a8);
    lVar1 = lVar1 + 4;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&samples.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(Generators, Uniform1DSeed) {
    std::vector<Float> samples;
    for (Float u : Uniform1D(1250))
        samples.push_back(u);

    // Different seed
    int i = 0;
    for (Float u : Uniform1D(samples.size(), 1)) {
        EXPECT_NE(u, samples[i]);
        ++i;
    }
}